

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  uchar *puVar1;
  int iVar2;
  size_t __n;
  size_t size;
  size_t len;
  int ret;
  size_t bits_local;
  uchar *buf_local;
  uchar *start_local;
  uchar **p_local;
  
  __n = (bits >> 3) + (long)(int)(uint)((bits & 7) != 0);
  if ((*p < start) || ((ulong)((long)*p - (long)start) < __n + 1)) {
    p_local._4_4_ = -0x6c;
  }
  else {
    *p = *p + -__n;
    memcpy(*p,buf,__n);
    puVar1 = *p;
    *p = puVar1 + -1;
    puVar1[-1] = (char)__n * '\b' - (char)bits;
    p_local._4_4_ = mbedtls_asn1_write_len(p,start,__n + 1);
    if (-1 < p_local._4_4_) {
      iVar2 = p_local._4_4_ + (int)(__n + 1);
      p_local._4_4_ = mbedtls_asn1_write_tag(p,start,'\x03');
      if (-1 < p_local._4_4_) {
        p_local._4_4_ = p_local._4_4_ + iVar2;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_bitstring( unsigned char **p, unsigned char *start,
                          const unsigned char *buf, size_t bits )
{
    int ret;
    size_t len = 0, size;

    size = ( bits / 8 ) + ( ( bits % 8 ) ? 1 : 0 );

    // Calculate byte length
    //
    if( *p < start || (size_t)( *p - start ) < size + 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    len = size + 1;
    (*p) -= size;
    memcpy( *p, buf, size );

    // Write unused bits
    //
    *--(*p) = (unsigned char) (size * 8 - bits);

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_BIT_STRING ) );

    return( (int) len );
}